

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrUtil.c
# Opt level: O0

char * Rwr_ManGetPractical(Rwr_Man_t *p)

{
  char *__s;
  int local_1c;
  int i;
  char *pPractical;
  Rwr_Man_t *p_local;
  
  __s = (char *)malloc((long)p->nFuncs);
  memset(__s,0,(long)p->nFuncs);
  *__s = '\x01';
  for (local_1c = 1; s_RwrPracticalClasses[local_1c] != 0; local_1c = local_1c + 1) {
    __s[s_RwrPracticalClasses[local_1c]] = '\x01';
  }
  return __s;
}

Assistant:

char * Rwr_ManGetPractical( Rwr_Man_t * p )
{
    char * pPractical;
    int i;
    pPractical = ABC_ALLOC( char, p->nFuncs );
    memset( pPractical, 0, sizeof(char) * p->nFuncs );
    pPractical[0] = 1;
    for ( i = 1; ; i++ )
    {
        if ( s_RwrPracticalClasses[i] == 0 )
            break;
        pPractical[ s_RwrPracticalClasses[i] ] = 1;
    }
    return pPractical;
}